

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::memorystatistics(tetgenmesh *this)

{
  unsigned_long local_30;
  unsigned_long totalalgomemory;
  unsigned_long totalt2shmemory;
  unsigned_long totalmeshmemory;
  int tetblocks;
  tetgenmesh *this_local;
  
  printf("Memory usage statistics:\n\n");
  totalmeshmemory._4_4_ = 0;
  this->tetrahedrons->pathblock = this->tetrahedrons->firstblock;
  while (this->tetrahedrons->pathblock != (void **)0x0) {
    totalmeshmemory._4_4_ = totalmeshmemory._4_4_ + 1;
    this->tetrahedrons->pathblock = (void **)*this->tetrahedrons->pathblock;
  }
  totalalgomemory = 0;
  totalt2shmemory =
       this->points->maxitems * (long)this->points->itembytes +
       this->tetrahedrons->maxitems * (long)this->tetrahedrons->itembytes;
  if ((this->b->plc != 0) || (this->b->refine != 0)) {
    totalt2shmemory =
         this->subfaces->maxitems * (long)this->subfaces->itembytes +
         this->subsegs->maxitems * (long)this->subsegs->itembytes + totalt2shmemory;
    totalalgomemory =
         this->tet2subpool->maxitems * (long)this->tet2subpool->itembytes +
         this->tet2segpool->maxitems * (long)this->tet2segpool->itembytes;
  }
  local_30 = this->cavetetlist->totalmemory + this->cavebdrylist->totalmemory +
             this->caveoldtetlist->totalmemory +
             this->flippool->maxitems * (long)this->flippool->itembytes;
  if ((this->b->plc != 0) || (this->b->refine != 0)) {
    local_30 = this->subsegstack->totalmemory + this->subfacstack->totalmemory +
               this->subvertstack->totalmemory + this->caveshlist->totalmemory +
               this->caveshbdlist->totalmemory + this->cavesegshlist->totalmemory +
               this->cavetetshlist->totalmemory + this->cavetetseglist->totalmemory +
               this->caveencshlist->totalmemory + this->caveencseglist->totalmemory +
               this->cavetetvertlist->totalmemory + this->unflipqueue->totalmemory + local_30;
  }
  printf("  Maximum number of tetrahedra:  %ld\n",this->tetrahedrons->maxitems);
  printf("  Maximum number of tet blocks (blocksize = %d):  %d\n",
         (ulong)(uint)this->b->tetrahedraperblock,(ulong)totalmeshmemory._4_4_);
  if ((this->b->plc == 0) && (this->b->refine == 0)) {
    printf("  Approximate memory for tetrahedralization (bytes):  ");
    printfcomma(this,totalt2shmemory);
    printf("\n");
  }
  else {
    printf("  Approximate memory for tetrahedral mesh (bytes):  ");
    printfcomma(this,totalt2shmemory);
    printf("\n");
    printf("  Approximate memory for extra pointers (bytes):  ");
    printfcomma(this,totalalgomemory);
    printf("\n");
  }
  printf("  Approximate memory for algorithms (bytes):  ");
  printfcomma(this,local_30);
  printf("\n");
  printf("  Approximate memory for working arrays (bytes):  ");
  printfcomma(this,this->totalworkmemory);
  printf("\n");
  printf("  Approximate total used memory (bytes):  ");
  printfcomma(this,totalt2shmemory + totalalgomemory + local_30 + this->totalworkmemory);
  printf("\n");
  printf("\n");
  return;
}

Assistant:

void tetgenmesh::memorystatistics()
{
  printf("Memory usage statistics:\n\n");
 
  // Count the number of blocks of tetrahedra. 
  int tetblocks = 0;
  tetrahedrons->pathblock = tetrahedrons->firstblock;
  while (tetrahedrons->pathblock != NULL) {
    tetblocks++;
    tetrahedrons->pathblock = (void **) *(tetrahedrons->pathblock);  
  }

  // Calculate the total memory (in bytes) used by storing meshes.
  unsigned long totalmeshmemory = 0l, totalt2shmemory = 0l;
  totalmeshmemory = points->maxitems * points->itembytes +
                    tetrahedrons->maxitems * tetrahedrons->itembytes;
  if (b->plc || b->refine) {
    totalmeshmemory += (subfaces->maxitems * subfaces->itembytes +
                        subsegs->maxitems * subsegs->itembytes);
    totalt2shmemory = (tet2subpool->maxitems * tet2subpool->itembytes +
                       tet2segpool->maxitems * tet2segpool->itembytes);
  }

  unsigned long totalalgomemory = 0l;
  totalalgomemory = cavetetlist->totalmemory + cavebdrylist->totalmemory +
                    caveoldtetlist->totalmemory + 
                    flippool->maxitems * flippool->itembytes;
  if (b->plc || b->refine) {
    totalalgomemory += (subsegstack->totalmemory + subfacstack->totalmemory +
                        subvertstack->totalmemory + 
                        caveshlist->totalmemory + caveshbdlist->totalmemory +
                        cavesegshlist->totalmemory +
                        cavetetshlist->totalmemory + 
                        cavetetseglist->totalmemory +
                        caveencshlist->totalmemory +
                        caveencseglist->totalmemory +
                        cavetetvertlist->totalmemory +
                        unflipqueue->totalmemory);
  }

  printf("  Maximum number of tetrahedra:  %ld\n", tetrahedrons->maxitems);
  printf("  Maximum number of tet blocks (blocksize = %d):  %d\n",
         b->tetrahedraperblock, tetblocks);
  /*
  if (b->plc || b->refine) {
    printf("  Approximate memory for tetrahedral mesh (bytes):  %ld\n",
           totalmeshmemory);
    
    printf("  Approximate memory for extra pointers (bytes):  %ld\n",
           totalt2shmemory);
  } else {
    printf("  Approximate memory for tetrahedralization (bytes):  %ld\n",
           totalmeshmemory);
  }
  printf("  Approximate memory for algorithms (bytes):  %ld\n",
         totalalgomemory);
  printf("  Approximate memory for working arrays (bytes):  %ld\n",
         totalworkmemory);
  printf("  Approximate total used memory (bytes):  %ld\n",
         totalmeshmemory + totalt2shmemory + totalalgomemory + 
         totalworkmemory);
  */
  if (b->plc || b->refine) {
    printf("  Approximate memory for tetrahedral mesh (bytes):  ");
    printfcomma(totalmeshmemory); printf("\n");
    
    printf("  Approximate memory for extra pointers (bytes):  ");
    printfcomma(totalt2shmemory); printf("\n");
  } else {
    printf("  Approximate memory for tetrahedralization (bytes):  ");
    printfcomma(totalmeshmemory); printf("\n");
  }
  printf("  Approximate memory for algorithms (bytes):  ");
  printfcomma(totalalgomemory); printf("\n");
  printf("  Approximate memory for working arrays (bytes):  ");
  printfcomma(totalworkmemory); printf("\n");
  printf("  Approximate total used memory (bytes):  ");
  printfcomma(totalmeshmemory + totalt2shmemory + totalalgomemory + 
              totalworkmemory);
  printf("\n");

  printf("\n");
}